

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O3

ConstantValue * __thiscall slang::ast::AttributeSymbol::getValue(AttributeSymbol *this)

{
  Symbol *symbol;
  Compilation *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  ConstantValue *pCVar3;
  Scope *pSVar4;
  LookupLocation LVar5;
  ASTContext context;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  ASTContext local_58;
  
  pCVar3 = this->value;
  if (pCVar3 == (ConstantValue *)0x0) {
    symbol = this->symbol;
    if (symbol == (Symbol *)0x0) {
      local_58.lookupIndex = (this->lookupLocation).index;
      pSVar4 = this->scope;
    }
    else {
      pSVar4 = symbol->parentScope;
      LVar5 = LookupLocation::before(symbol);
      local_58.lookupIndex = LVar5.index;
    }
    local_58.flags.m_bits = 0x20;
    local_58.instanceOrProc = (Symbol *)0x0;
    local_58.firstTempVar = (TempVarSymbol *)0x0;
    local_58.randomizeDetails = (RandomizeDetails *)0x0;
    local_58.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_58.scope.ptr = pSVar4;
    iVar2 = Expression::bind((int)this->expr,(sockaddr *)&local_58,0);
    pCVar1 = pSVar4->compilation;
    ASTContext::eval((ConstantValue *)&local_80,&local_58,(Expression *)CONCAT44(extraout_var,iVar2)
                     ,(bitmask<slang::ast::EvalFlags>)0x0);
    pCVar3 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&pCVar1->constantAllocator,(ConstantValue *)&local_80);
    this->value = pCVar3;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_80);
    pCVar3 = this->value;
  }
  return pCVar3;
}

Assistant:

const ConstantValue& AttributeSymbol::getValue() const {
    if (!value) {
        LookupLocation loc = lookupLocation;
        auto bindScope = scope;
        if (symbol) {
            bindScope = symbol->getParentScope();
            loc = LookupLocation::before(*symbol);
        }

        SLANG_ASSERT(bindScope);
        SLANG_ASSERT(expr);

        ASTContext context(*bindScope, loc, ASTFlags::NonProcedural);
        auto& bound = Expression::bind(*expr, context);

        value = bindScope->getCompilation().allocConstant(context.eval(bound));
    }

    return *value;
}